

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

CAmount __thiscall wallet::SelectionResult::GetSelectedValue(SelectionResult *this)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  long lVar4;
  long in_FS_OFFSET;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::cbegin(in_stack_ffffffffffffffd0);
  iVar3 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::cend(in_stack_ffffffffffffffd0);
  lVar4 = std::
          accumulate<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>>,long,wallet::SelectionResult::GetSelectedValue()const::__0>
                    (iVar2._M_node,iVar3._M_node,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar4;
  }
  __stack_chk_fail();
}

Assistant:

CAmount SelectionResult::GetSelectedValue() const
{
    return std::accumulate(m_selected_inputs.cbegin(), m_selected_inputs.cend(), CAmount{0}, [](CAmount sum, const auto& coin) { return sum + coin->txout.nValue; });
}